

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O3

void kf_work(kiss_fft_cpx *Fout,kiss_fft_cpx *f,size_t fstride,int in_stride,int *factors,
            kiss_fft_cfg st)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  float *__ptr;
  long lVar5;
  long lVar6;
  kiss_fft_cpx *pkVar7;
  kiss_fft_cpx *pkVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  float fVar15;
  float fVar20;
  kiss_fft_cpx kVar16;
  kiss_fft_cpx kVar17;
  kiss_fft_cpx kVar18;
  kiss_fft_cpx kVar19;
  float fVar21;
  kiss_fft_cpx kVar22;
  kiss_fft_cpx kVar23;
  kiss_fft_cpx kVar24;
  float fVar25;
  kiss_fft_cpx kVar26;
  kiss_fft_cpx kVar27;
  kiss_fft_cpx kVar28;
  float fVar29;
  float fVar31;
  kiss_fft_cpx kVar30;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  long local_68;
  kiss_fft_cpx *local_60;
  int local_50;
  
  uVar3 = *factors;
  iVar11 = factors[1];
  lVar5 = (long)iVar11;
  if (lVar5 == 1) {
    lVar6 = 0;
    do {
      *(kiss_fft_cpx *)((long)&Fout->r + lVar6) = *f;
      f = f + (long)in_stride * fstride;
      lVar6 = lVar6 + 8;
    } while ((long)(int)(iVar11 * uVar3) * 8 != lVar6);
  }
  else {
    lVar6 = 0;
    do {
      kf_work((kiss_fft_cpx *)((long)&Fout->r + lVar6),f,(long)(int)uVar3 * fstride,in_stride,
              factors + 2,st);
      f = f + (long)in_stride * fstride;
      lVar6 = lVar6 + lVar5 * 8;
    } while ((long)(int)(iVar11 * uVar3) * 8 != lVar6);
  }
  switch(uVar3) {
  case 2:
    pkVar7 = st->twiddles;
    lVar6 = 0;
    do {
      fVar20 = (*pkVar7).r;
      fVar21 = (*pkVar7).i;
      fVar15 = Fout[lVar5 + lVar6].r * fVar20 + fVar21 * -Fout[lVar5 + lVar6].i;
      fVar20 = Fout[lVar5 + lVar6].r * fVar21 + fVar20 * Fout[lVar5 + lVar6].i;
      kVar22.r = Fout[lVar6].r - fVar15;
      kVar22.i = Fout[lVar6].i - fVar20;
      Fout[lVar5 + lVar6] = kVar22;
      kVar23.r = Fout[lVar6].r + fVar15;
      kVar23.i = Fout[lVar6].i + fVar20;
      Fout[lVar6] = kVar23;
      lVar6 = lVar6 + 1;
      pkVar7 = pkVar7 + fstride;
    } while (iVar11 != (int)lVar6);
    break;
  case 3:
    fVar15 = st->twiddles[lVar5 * fstride].i;
    lVar10 = 0;
    lVar6 = lVar5;
    do {
      uVar1 = *(undefined8 *)((long)&st->twiddles[0].r + lVar10);
      fVar20 = (float)uVar1;
      fVar21 = (float)((ulong)uVar1 >> 0x20);
      fVar25 = Fout[lVar5].r * fVar21 + Fout[lVar5].i * fVar20;
      fVar40 = Fout[lVar5].r * fVar20 + -Fout[lVar5].i * fVar21;
      uVar1 = *(undefined8 *)((long)&st->twiddles[0].r + lVar10 * 2);
      fVar21 = (float)uVar1;
      fVar35 = (float)((ulong)uVar1 >> 0x20);
      fVar20 = Fout[lVar5 * 2].r * fVar35 + Fout[lVar5 * 2].i * fVar21;
      fVar21 = Fout[lVar5 * 2].r * fVar21 + -Fout[lVar5 * 2].i * fVar35;
      fVar35 = (fVar25 - fVar20) * fVar15;
      fVar33 = (fVar40 - fVar21) * fVar15;
      fVar20 = fVar20 + fVar25;
      fVar21 = fVar21 + fVar40;
      kVar27.i = fVar20 * -0.5 + (*Fout).i;
      kVar27.r = fVar21 * -0.5 + (*Fout).r;
      Fout[lVar5] = kVar27;
      kVar28.r = (*Fout).r + fVar21;
      kVar28.i = (*Fout).i + fVar20;
      *Fout = kVar28;
      kVar26.i = Fout[lVar5].i - fVar33;
      kVar26.r = Fout[lVar5].r + fVar35;
      Fout[lVar5 * 2] = kVar26;
      kVar30.i = fVar33 + Fout[lVar5].i;
      kVar30.r = Fout[lVar5].r - fVar35;
      Fout[lVar5] = kVar30;
      Fout = Fout + 1;
      lVar10 = lVar10 + fstride * 8;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    break;
  case 4:
    iVar11 = st->inverse;
    pkVar8 = st->twiddles;
    lVar6 = 0;
    lVar10 = 0;
    pkVar7 = pkVar8;
    do {
      uVar1 = *(undefined8 *)((long)&pkVar8->r + lVar10);
      fVar15 = (float)uVar1;
      fVar20 = (float)((ulong)uVar1 >> 0x20);
      fVar21 = Fout[lVar5 + lVar6].r * fVar20 + Fout[lVar5 + lVar6].i * fVar15;
      fVar25 = Fout[lVar5 + lVar6].r * fVar15 + -Fout[lVar5 + lVar6].i * fVar20;
      uVar1 = *(undefined8 *)((long)&pkVar8->r + lVar10 * 2);
      fVar20 = (float)uVar1;
      fVar40 = (float)((ulong)uVar1 >> 0x20);
      fVar15 = Fout[lVar5 * 2 + lVar6].r * fVar20 + fVar40 * -Fout[lVar5 * 2 + lVar6].i;
      fVar20 = Fout[lVar5 * 2 + lVar6].r * fVar40 + fVar20 * Fout[lVar5 * 2 + lVar6].i;
      fVar35 = (*pkVar7).r;
      fVar33 = (*pkVar7).i;
      fVar40 = Fout[lVar5 * 3 + lVar6].r * fVar33 + Fout[lVar5 * 3 + lVar6].i * fVar35;
      fVar35 = Fout[lVar5 * 3 + lVar6].r * fVar35 + -Fout[lVar5 * 3 + lVar6].i * fVar33;
      fVar36 = Fout[lVar6].r;
      fVar38 = Fout[lVar6].i;
      fVar33 = fVar36 - fVar15;
      fVar34 = fVar38 - fVar20;
      kVar16.r = fVar15 + fVar36;
      kVar16.i = fVar20 + fVar38;
      Fout[lVar6] = kVar16;
      fVar15 = fVar21 - fVar40;
      fVar20 = fVar25 - fVar35;
      fVar40 = fVar40 + fVar21;
      fVar35 = fVar35 + fVar25;
      kVar17.r = kVar16.r - fVar35;
      kVar17.i = kVar16.i - fVar40;
      Fout[lVar5 * 2 + lVar6] = kVar17;
      kVar18.r = Fout[lVar6].r + fVar35;
      kVar18.i = Fout[lVar6].i + fVar40;
      Fout[lVar6] = kVar18;
      if (iVar11 == 0) {
        fVar21 = fVar33 + fVar15;
        fVar25 = fVar34 + fVar20;
        fVar33 = fVar33 - fVar15;
        fVar34 = fVar34 - fVar20;
      }
      else {
        fVar21 = fVar33 - fVar15;
        fVar25 = fVar34 - fVar20;
        fVar33 = fVar33 + fVar15;
        fVar34 = fVar34 + fVar20;
      }
      kVar24.i = fVar34;
      kVar24.r = fVar21;
      kVar19.i = fVar25;
      kVar19.r = fVar33;
      pkVar7 = pkVar7 + fstride * 3;
      Fout[lVar5 + lVar6] = kVar24;
      Fout[lVar5 * 3 + lVar6] = kVar19;
      lVar10 = lVar10 + fstride * 8;
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
    break;
  case 5:
    if (0 < iVar11) {
      lVar6 = fstride * 2 * lVar5;
      fVar15 = st->twiddles[lVar6].r;
      fVar20 = st->twiddles[lVar6].i;
      fVar21 = st->twiddles[lVar5 * fstride].r;
      fVar25 = st->twiddles[lVar5 * fstride].i;
      lVar6 = 0;
      lVar10 = 0;
      lVar13 = 0;
      do {
        fVar40 = *(float *)((long)&Fout[lVar5].r + lVar10);
        fVar35 = *(float *)((long)&Fout[lVar5].i + lVar10);
        fVar33 = *(float *)((long)&Fout[(uint)(iVar11 * 2)].r + lVar10);
        fVar34 = *(float *)((long)&Fout[(uint)(iVar11 * 2)].i + lVar10);
        fVar36 = *(float *)((long)&Fout[(uint)(iVar11 * 3)].r + lVar10);
        fVar38 = *(float *)((long)&Fout[(uint)(iVar11 * 3)].i + lVar10);
        uVar1 = *(undefined8 *)((long)&st->twiddles[0].r + lVar13);
        fVar31 = (float)uVar1;
        fVar32 = (float)((ulong)uVar1 >> 0x20);
        fVar29 = fVar40 * fVar31 + fVar32 * -fVar35;
        fVar31 = fVar40 * fVar32 + fVar31 * fVar35;
        fVar40 = *(float *)((long)&Fout[(uint)(iVar11 * 4)].r + lVar10);
        uVar1 = *(undefined8 *)((long)&st->twiddles[0].r + lVar13 * 2);
        fVar37 = (float)uVar1;
        fVar39 = (float)((ulong)uVar1 >> 0x20);
        fVar35 = *(float *)((long)&Fout[(uint)(iVar11 * 4)].i + lVar10);
        fVar32 = fVar33 * fVar37 + fVar39 * -fVar34;
        fVar33 = fVar33 * fVar39 + fVar37 * fVar34;
        uVar1 = *(undefined8 *)((long)&st->twiddles[0].r + lVar6);
        fVar37 = (float)uVar1;
        fVar39 = (float)((ulong)uVar1 >> 0x20);
        uVar1 = *(undefined8 *)((long)&Fout->r + lVar10);
        fVar34 = fVar36 * fVar37 + fVar39 * -fVar38;
        fVar36 = fVar36 * fVar39 + fVar37 * fVar38;
        uVar2 = *(undefined8 *)(&st->twiddles[0].r + lVar13);
        fVar38 = (float)uVar2;
        fVar37 = (float)((ulong)uVar2 >> 0x20);
        fVar39 = fVar40 * fVar38 + fVar37 * -fVar35;
        fVar40 = fVar40 * fVar37 + fVar38 * fVar35;
        fVar41 = fVar29 + fVar39;
        fVar42 = fVar31 + fVar40;
        fVar29 = fVar29 - fVar39;
        fVar31 = fVar31 - fVar40;
        fVar40 = fVar32 + fVar34;
        fVar38 = fVar33 + fVar36;
        fVar33 = fVar33 - fVar36;
        fVar36 = (float)uVar1;
        fVar37 = (float)((ulong)uVar1 >> 0x20);
        *(ulong *)((long)&Fout->r + lVar10) =
             CONCAT44(fVar38 + fVar42 + fVar37,fVar40 + fVar41 + fVar36);
        fVar39 = fVar40 * fVar15 + fVar41 * fVar21 + fVar36;
        fVar43 = fVar38 * fVar15 + fVar42 * fVar21 + fVar37;
        fVar35 = -(fVar32 - fVar34);
        fVar34 = fVar31 * fVar25 + fVar20 * fVar33;
        fVar32 = -fVar29 * fVar25 + fVar20 * fVar35;
        *(ulong *)((long)&Fout[lVar5].r + lVar10) = CONCAT44(fVar43 - fVar32,fVar39 - fVar34);
        *(ulong *)((long)&Fout[(uint)(iVar11 * 4)].r + lVar10) =
             CONCAT44(fVar32 + fVar43,fVar34 + fVar39);
        fVar34 = fVar40 * fVar21 + fVar41 * fVar15 + fVar36;
        fVar36 = fVar38 * fVar21 + fVar42 * fVar15 + fVar37;
        fVar40 = -fVar31 * fVar20 + fVar33 * fVar25;
        fVar35 = fVar29 * fVar20 + fVar35 * fVar25;
        *(float *)((long)&Fout[(uint)(iVar11 * 2)].r + lVar10) = fVar40 + fVar34;
        *(float *)((long)&Fout[(uint)(iVar11 * 2)].i + lVar10) = fVar35 + fVar36;
        *(ulong *)((long)&Fout[(uint)(iVar11 * 3)].r + lVar10) =
             CONCAT44(fVar36 - fVar35,fVar34 - fVar40);
        lVar13 = lVar13 + fstride * 8;
        lVar10 = lVar10 + 8;
        lVar6 = lVar6 + fstride * 0x18;
      } while (lVar5 << 3 != lVar10);
    }
    break;
  default:
    iVar4 = st->nfft;
    __ptr = (float *)malloc((long)(int)uVar3 * 8);
    if (0 < iVar11) {
      local_68 = 0;
      local_60 = Fout;
      do {
        if (0 < (int)uVar3) {
          uVar12 = 0;
          pkVar7 = local_60;
          do {
            *(kiss_fft_cpx *)(__ptr + uVar12 * 2) = *pkVar7;
            uVar12 = uVar12 + 1;
            pkVar7 = pkVar7 + lVar5;
          } while (uVar3 != uVar12);
          fVar15 = *__ptr;
          fVar20 = __ptr[1];
          uVar14 = 0;
          lVar6 = local_68;
          do {
            Fout[lVar6].r = fVar15;
            Fout[lVar6].i = fVar20;
            if (1 < (int)uVar3) {
              local_50 = (int)fstride;
              lVar10 = 0;
              iVar11 = 0;
              fVar21 = fVar15;
              fVar25 = fVar20;
              do {
                iVar11 = iVar11 + (int)lVar6 * local_50;
                iVar9 = iVar4;
                if (iVar11 < iVar4) {
                  iVar9 = 0;
                }
                iVar11 = iVar11 - iVar9;
                fVar40 = st->twiddles[iVar11].r;
                fVar35 = st->twiddles[iVar11].i;
                fVar21 = fVar21 + __ptr[lVar10 * 2 + 2] * fVar40 + fVar35 * -__ptr[lVar10 * 2 + 3];
                fVar25 = fVar25 + __ptr[lVar10 * 2 + 2] * fVar35 + fVar40 * __ptr[lVar10 * 2 + 3];
                Fout[lVar6].r = fVar21;
                Fout[lVar6].i = fVar25;
                lVar10 = lVar10 + 1;
              } while ((ulong)uVar3 - 1 != lVar10);
            }
            lVar6 = lVar6 + lVar5;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar3);
        }
        local_68 = local_68 + 1;
        local_60 = local_60 + 1;
      } while (local_68 != lVar5);
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

static
void kf_work(
        kiss_fft_cpx * Fout,
        const kiss_fft_cpx * f,
        const size_t fstride,
        int in_stride,
        int * factors,
        const kiss_fft_cfg st
        )
{
    kiss_fft_cpx * Fout_beg=Fout;
    const int p=*factors++; /* the radix  */
    const int m=*factors++; /* stage's fft length/p */
    const kiss_fft_cpx * Fout_end = Fout + p*m;

#ifdef _OPENMP
    // use openmp extensions at the 
    // top-level (not recursive)
    if (fstride==1 && p<=5)
    {
        int k;

        // execute the p different work units in different threads
#       pragma omp parallel for
        for (k=0;k<p;++k) 
            kf_work( Fout +k*m, f+ fstride*in_stride*k,fstride*p,in_stride,factors,st);
        // all threads have joined by this point

        switch (p) {
            case 2: kf_bfly2(Fout,fstride,st,m); break;
            case 3: kf_bfly3(Fout,fstride,st,m); break; 
            case 4: kf_bfly4(Fout,fstride,st,m); break;
            case 5: kf_bfly5(Fout,fstride,st,m); break; 
            default: kf_bfly_generic(Fout,fstride,st,m,p); break;
        }
        return;
    }
#endif

    if (m==1) {
        do{
            *Fout = *f;
            f += fstride*in_stride;
        }while(++Fout != Fout_end );
    }else{
        do{
            // recursive call:
            // DFT of size m*p performed by doing
            // p instances of smaller DFTs of size m, 
            // each one takes a decimated version of the input
            kf_work( Fout , f, fstride*p, in_stride, factors,st);
            f += fstride*in_stride;
        }while( (Fout += m) != Fout_end );
    }

    Fout=Fout_beg;

    // recombine the p smaller DFTs 
    switch (p) {
        case 2: kf_bfly2(Fout,fstride,st,m); break;
        case 3: kf_bfly3(Fout,fstride,st,m); break; 
        case 4: kf_bfly4(Fout,fstride,st,m); break;
        case 5: kf_bfly5(Fout,fstride,st,m); break; 
        default: kf_bfly_generic(Fout,fstride,st,m,p); break;
    }
}